

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(short lhs,
         SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  int iVar1;
  undefined6 in_register_0000003a;
  bool bVar2;
  short ret;
  short local_10;
  short local_e;
  int local_c;
  
  bVar2 = (int)CONCAT62(in_register_0000003a,lhs) == -0x8000;
  if (rhs.m_int == -1 && bVar2) {
    iVar1 = (uint)(rhs.m_int == -1 && bVar2) << 0xf;
  }
  else {
    local_e = 0;
    local_10 = lhs;
    local_c = rhs.m_int;
    DivisionHelper<short,int,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_10,&local_c,&local_e);
    iVar1 = (int)local_e;
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)iVar1
  ;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}